

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bitmap.cpp
# Opt level: O0

bool __thiscall ON_WindowsBitmap::IsValid(ON_WindowsBitmap *this,ON_TextLog *text_log)

{
  bool bVar1;
  int iVar2;
  bool rc;
  ON_TextLog *text_log_local;
  ON_WindowsBitmap *this_local;
  
  bVar1 = false;
  if (this->m_bmi != (ON_WindowsBITMAPINFO *)0x0) {
    bVar1 = false;
    if (this->m_bits != (uchar *)0x0) {
      iVar2 = (*(this->super_ON_Bitmap).super_ON_ModelComponent.super_ON_Object._vptr_ON_Object
                [0x18])();
      bVar1 = false;
      if (0 < iVar2) {
        iVar2 = (*(this->super_ON_Bitmap).super_ON_ModelComponent.super_ON_Object._vptr_ON_Object
                  [0x19])();
        bVar1 = 0 < iVar2;
      }
    }
  }
  if ((!bVar1) && (text_log != (ON_TextLog *)0x0)) {
    ON_TextLog::Print(text_log,"ON_WindowsBitmap is not valid\n");
  }
  return bVar1;
}

Assistant:

bool ON_WindowsBitmap::IsValid( ON_TextLog* text_log ) const
{
  bool rc 
    = ( m_bmi != nullptr && m_bits != nullptr && Width() > 0 && Height() > 0) 
    ? true
    : false;

  if ( !rc && 0 != text_log )
  {
    // TODO:  add a detailed diagnostic message
    text_log->Print("ON_WindowsBitmap is not valid\n");
  }
  return rc;
}